

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
consistentStringProperty
          (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,string *lhs,string *rhs)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  pointer __s1;
  undefined4 *local_40;
  long local_38;
  undefined4 local_30;
  undefined4 uStack_2c;
  
  __n = lhs->_M_string_length;
  if (__n == rhs->_M_string_length) {
    if (__n == 0) {
      __s1 = (lhs->_M_dataplus)._M_p;
    }
    else {
      __s1 = (lhs->_M_dataplus)._M_p;
      iVar2 = bcmp(__s1,(rhs->_M_dataplus)._M_p,__n);
      if (iVar2 != 0) goto LAB_00331e60;
    }
    local_40 = &local_30;
    std::__cxx11::string::_M_construct<char*>((string *)&local_40,__s1,__s1 + __n);
    bVar1 = true;
  }
  else {
LAB_00331e60:
    local_40 = &local_30;
    local_30 = 0x736e7528;
    local_38 = 7;
    uStack_2c = 0x297465;
    bVar1 = false;
  }
  __return_storage_ptr__->first = bVar1;
  (__return_storage_ptr__->second)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->second).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->second,local_40,local_38 + (long)local_40);
  if (local_40 != &local_30) {
    operator_delete(local_40,CONCAT44(uStack_2c,local_30) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<bool, std::string> consistentStringProperty(const std::string& lhs,
                                                      const std::string& rhs)
{
  const bool b = lhs == rhs;
  return std::make_pair(b, b ? lhs : valueAsString(nullptr));
}